

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O3

StringRef __thiscall llbuild::buildsystem::BuildKey::getStatName(BuildKey *this)

{
  Kind KVar1;
  StringRef SVar2;
  
  KVar1 = kindForIdentifier(*(this->key).key._M_dataplus._M_p);
  if (KVar1 == Stat) {
    SVar2.Data = (this->key).key._M_dataplus._M_p + 1;
    SVar2.Length = (this->key).key._M_string_length - 1;
    return SVar2;
  }
  __assert_fail("isStat()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0x11b,"StringRef llbuild::buildsystem::BuildKey::getStatName() const");
}

Assistant:

StringRef getStatName() const {
    assert(isStat());
    return StringRef(key.data()+1, key.size()-1);
  }